

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EnforceProto3OptionalSupport
          (CommandLineInterface *this,string *codegen_name,uint64_t supported_features,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  FileDescriptor *desc;
  bool bVar1;
  Edition edition;
  reference ppFVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  ostream *poVar4;
  string_view __str;
  FileDescriptor *fd;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *__range3;
  bool supports_proto3_optional;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *parsed_files_local;
  uint64_t supported_features_local;
  string *codegen_name_local;
  CommandLineInterface *this_local;
  
  if ((supported_features & 1) == 0) {
    __end3 = std::
             vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ::begin(parsed_files);
    fd = (FileDescriptor *)
         std::
         vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         ::end(parsed_files);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                                       *)&fd), bVar1) {
      ppFVar2 = __gnu_cxx::
                __normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                ::operator*(&__end3);
      desc = *ppFVar2;
      edition = internal::InternalFeatureHelper::GetEdition(desc);
      bVar1 = anon_unknown_5::ContainsProto3Optional(edition,desc);
      if (bVar1) {
        __str = FileDescriptor::name(desc);
        pbVar3 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,__str);
        poVar4 = std::operator<<(pbVar3,
                                 ": is a proto3 file that contains optional fields, but code generator "
                                );
        poVar4 = std::operator<<(poVar4,(string *)codegen_name);
        poVar4 = std::operator<<(poVar4,
                                 " hasn\'t been updated to support optional fields in proto3. Please ask the owner of this code generator to support proto3 optional."
                                );
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        return false;
      }
      __gnu_cxx::
      __normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
      ::operator++(&__end3);
    }
  }
  return true;
}

Assistant:

bool CommandLineInterface::EnforceProto3OptionalSupport(
    const std::string& codegen_name, uint64_t supported_features,
    const std::vector<const FileDescriptor*>& parsed_files) const {
  bool supports_proto3_optional =
      supported_features & CodeGenerator::FEATURE_PROTO3_OPTIONAL;
  if (!supports_proto3_optional) {
    for (const auto fd : parsed_files) {
      if (ContainsProto3Optional(
              ::google::protobuf::internal::InternalFeatureHelper::GetEdition(*fd), fd)) {
        std::cerr << fd->name()
                  << ": is a proto3 file that contains optional fields, but "
                     "code generator "
                  << codegen_name
                  << " hasn't been updated to support optional fields in "
                     "proto3. Please ask the owner of this code generator to "
                     "support proto3 optional."
                  << std::endl;
        return false;
      }
    }
  }
  return true;
}